

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_AddKVPair(ktxHashList *pHead,char *key,uint valueLen,void *value)

{
  uint *puVar1;
  UT_hash_bucket *pUVar2;
  ktxHashList pkVar3;
  UT_hash_table *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_bucket *pUVar6;
  UT_hash_handle *pUVar7;
  UT_hash_handle *pUVar8;
  size_t sVar9;
  ktxHashList pkVar10;
  UT_hash_table *pUVar11;
  UT_hash_bucket *pUVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ktx_error_code_e kVar22;
  UT_hash_handle *pUVar23;
  char *_hj_key;
  void *__dest;
  char *pcVar24;
  
  kVar22 = KTX_INVALID_VALUE;
  if ((key != (char *)0x0 && pHead != (ktxHashList *)0x0) && (valueLen == 0 || value != (void *)0x0)
     ) {
    sVar9 = strlen(key);
    if ((int)sVar9 == 0) {
      return KTX_INVALID_VALUE;
    }
    uVar15 = (int)sVar9 + 1;
    uVar21 = (ulong)uVar15;
    pkVar10 = (ktxHashList)malloc(valueLen + uVar21 + 0x58);
    pkVar3 = pkVar10 + 1;
    pkVar10->key = (char *)pkVar3;
    pkVar10->keyLen = uVar15;
    memcpy(pkVar3,key,uVar21);
    pkVar10->valueLen = valueLen;
    if (valueLen == 0) {
      pkVar10->value = (void *)0x0;
    }
    else {
      __dest = (void *)((long)&pkVar3->keyLen + uVar21);
      pkVar10->value = __dest;
      memcpy(__dest,value,(ulong)valueLen);
    }
    pUVar23 = &pkVar10->hh;
    (pkVar10->hh).next = (void *)0x0;
    pcVar24 = pkVar10->key;
    (pkVar10->hh).key = pcVar24;
    uVar15 = pkVar10->keyLen - 1;
    (pkVar10->hh).keylen = uVar15;
    if (*pHead == (ktxHashList)0x0) {
      *pHead = pkVar10;
      (pkVar10->hh).prev = (void *)0x0;
      pUVar11 = (UT_hash_table *)malloc(0x40);
      (pkVar10->hh).tbl = pUVar11;
      if (pUVar11 == (UT_hash_table *)0x0) goto LAB_001ead29;
      *(undefined8 *)&pUVar11->num_items = 0;
      pUVar11->tail = (UT_hash_handle *)0x0;
      pUVar11->buckets = (UT_hash_bucket *)0x0;
      pUVar11->num_buckets = 0;
      pUVar11->log2_num_buckets = 0;
      pUVar11->hho = 0;
      pUVar11->ideal_chain_maxlen = 0;
      pUVar11->nonideal_items = 0;
      pUVar11->ineff_expands = 0;
      pUVar11->noexpand = 0;
      *(undefined8 *)&pUVar11->signature = 0;
      pUVar11->tail = pUVar23;
      pUVar11->num_buckets = 0x20;
      pUVar11->log2_num_buckets = 5;
      pUVar11->hho = 0x20;
      pUVar12 = (UT_hash_bucket *)malloc(0x200);
      pUVar11->buckets = pUVar12;
      if (pUVar12 == (UT_hash_bucket *)0x0) goto LAB_001ead29;
      memset(pUVar12,0,0x200);
      pUVar11->signature = 0xa0111fe1;
    }
    else {
      (((*pHead)->hh).tbl)->tail->next = pkVar10;
      pUVar11 = ((*pHead)->hh).tbl;
      (pkVar10->hh).prev = (void *)((long)pUVar11->tail - pUVar11->hho);
      pUVar11->tail = pUVar23;
    }
    pkVar3 = *pHead;
    pUVar11 = (pkVar3->hh).tbl;
    pUVar11->num_items = pUVar11->num_items + 1;
    (pkVar10->hh).tbl = pUVar11;
    (pkVar10->hh).hashv = 0xfeedbeef;
    uVar17 = 0x9e3779b9;
    uVar16 = uVar15;
    if (uVar15 < 0xc) {
      uVar14 = 0x9e3779b9;
    }
    else {
      uVar18 = (pkVar10->hh).hashv;
      uVar14 = 0x9e3779b9;
      uVar17 = 0x9e3779b9;
      do {
        iVar13 = (uint)(byte)pcVar24[7] * 0x1000000 + pcVar24[6] * 0x10000 +
                 pcVar24[5] * 0x100 + (int)pcVar24[4] + uVar17;
        uVar17 = (uint)(byte)pcVar24[0xb] * 0x1000000 +
                 pcVar24[10] * 0x10000 + uVar18 + pcVar24[9] * 0x100 + (int)pcVar24[8];
        uVar18 = uVar17 >> 0xd ^
                 (((uint)(byte)pcVar24[3] * 0x1000000 + pcVar24[2] * 0x10000 +
                  pcVar24[1] * 0x100 + (int)*pcVar24 + uVar14) - iVar13) - uVar17;
        uVar14 = uVar18 << 8 ^ (iVar13 - uVar17) - uVar18;
        uVar17 = uVar14 >> 0xd ^ (uVar17 - uVar18) - uVar14;
        uVar18 = uVar17 >> 0xc ^ (uVar18 - uVar14) - uVar17;
        uVar19 = uVar18 << 0x10 ^ (uVar14 - uVar17) - uVar18;
        uVar20 = uVar19 >> 5 ^ (uVar17 - uVar18) - uVar19;
        uVar14 = uVar20 >> 3 ^ (uVar18 - uVar19) - uVar20;
        uVar17 = uVar14 << 10 ^ (uVar19 - uVar20) - uVar14;
        uVar18 = uVar17 >> 0xf ^ (uVar20 - uVar14) - uVar17;
        (pkVar10->hh).hashv = uVar18;
        pcVar24 = pcVar24 + 0xc;
        uVar16 = uVar16 - 0xc;
      } while (0xb < uVar16);
    }
    uVar15 = uVar15 + (pkVar10->hh).hashv;
    (pkVar10->hh).hashv = uVar15;
    switch(uVar16) {
    case 0xb:
      (pkVar10->hh).hashv = (uint)(byte)pcVar24[10] * 0x1000000 + uVar15;
    case 10:
      puVar1 = &(pkVar10->hh).hashv;
      *puVar1 = *puVar1 + pcVar24[9] * 0x10000;
    case 9:
      puVar1 = &(pkVar10->hh).hashv;
      *puVar1 = *puVar1 + pcVar24[8] * 0x100;
    case 8:
      uVar17 = (uint)(byte)pcVar24[7] * 0x1000000 + uVar17;
    case 7:
      uVar17 = pcVar24[6] * 0x10000 + uVar17;
    case 6:
      uVar17 = pcVar24[5] * 0x100 + uVar17;
    case 5:
      uVar17 = (int)pcVar24[4] + uVar17;
    case 4:
      uVar14 = (uint)(byte)pcVar24[3] * 0x1000000 + uVar14;
    case 3:
      uVar14 = pcVar24[2] * 0x10000 + uVar14;
    case 2:
      uVar14 = pcVar24[1] * 0x100 + uVar14;
    case 1:
      uVar14 = (int)*pcVar24 + uVar14;
    }
    uVar15 = (pkVar10->hh).hashv;
    uVar14 = uVar15 >> 0xd ^ (uVar14 - uVar17) - uVar15;
    uVar16 = uVar14 << 8 ^ (uVar17 - uVar15) - uVar14;
    uVar15 = uVar16 >> 0xd ^ (uVar15 - uVar14) - uVar16;
    uVar17 = uVar15 >> 0xc ^ (uVar14 - uVar16) - uVar15;
    uVar14 = uVar17 << 0x10 ^ (uVar16 - uVar15) - uVar17;
    uVar16 = uVar14 >> 5 ^ (uVar15 - uVar17) - uVar14;
    uVar15 = uVar16 >> 3 ^ (uVar17 - uVar14) - uVar16;
    uVar17 = uVar15 << 10 ^ (uVar14 - uVar16) - uVar15;
    uVar15 = uVar17 >> 0xf ^ uVar16 - (uVar15 + uVar17);
    (pkVar10->hh).hashv = uVar15;
    pUVar4 = (pkVar3->hh).tbl;
    uVar15 = pUVar4->num_buckets - 1 & uVar15;
    pUVar12 = pUVar4->buckets;
    puVar1 = &pUVar12[uVar15].count;
    *puVar1 = *puVar1 + 1;
    pUVar5 = pUVar12[uVar15].hh_head;
    (pkVar10->hh).hh_next = pUVar5;
    (pkVar10->hh).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar5 != (UT_hash_handle *)0x0) {
      pUVar5->hh_prev = pUVar23;
    }
    (((*pHead)->hh).tbl)->buckets[uVar15].hh_head = pUVar23;
    pUVar12 = (((*pHead)->hh).tbl)->buckets;
    kVar22 = KTX_SUCCESS;
    if ((pUVar12[uVar15].expand_mult * 10 + 10 <= pUVar12[uVar15].count) && (pUVar11->noexpand != 1)
       ) {
      sVar9 = (ulong)(pUVar11->num_buckets * 2) << 4;
      pUVar12 = (UT_hash_bucket *)malloc(sVar9);
      if (pUVar12 == (UT_hash_bucket *)0x0) {
LAB_001ead29:
        exit(-1);
      }
      uVar17 = 0;
      memset(pUVar12,0,sVar9);
      uVar15 = pUVar11->num_buckets;
      uVar16 = pUVar11->log2_num_buckets + 1;
      uVar18 = uVar15 * 2 - 1;
      uVar14 = ((pUVar11->num_items >> ((byte)uVar16 & 0x1f)) + 1) -
               (uint)((uVar18 & pUVar11->num_items) == 0);
      pUVar11->ideal_chain_maxlen = uVar14;
      pUVar11->nonideal_items = 0;
      if ((ulong)uVar15 != 0) {
        pUVar6 = pUVar11->buckets;
        uVar21 = 0;
        do {
          pUVar5 = pUVar6[uVar21].hh_head;
          while (pUVar5 != (UT_hash_handle *)0x0) {
            pUVar7 = pUVar5->hh_next;
            uVar20 = pUVar5->hashv & uVar18;
            pUVar2 = pUVar12 + uVar20;
            uVar19 = pUVar12[uVar20].count + 1;
            pUVar12[uVar20].count = uVar19;
            if (uVar14 < uVar19) {
              pUVar11->nonideal_items = pUVar11->nonideal_items + 1;
              pUVar2->expand_mult = uVar19 / uVar14;
            }
            pUVar5->hh_prev = (UT_hash_handle *)0x0;
            pUVar8 = pUVar2->hh_head;
            pUVar5->hh_next = pUVar8;
            if (pUVar8 != (UT_hash_handle *)0x0) {
              pUVar8->hh_prev = pUVar5;
            }
            pUVar2->hh_head = pUVar5;
            pUVar5 = pUVar7;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar15);
      }
      pUVar11->num_buckets = uVar15 * 2;
      pUVar11->log2_num_buckets = uVar16;
      free(pUVar11->buckets);
      pUVar11 = pUVar23->tbl;
      pUVar11->buckets = pUVar12;
      if (pUVar11->num_items >> 1 < pUVar11->nonideal_items) {
        uVar17 = pUVar11->ineff_expands + 1;
      }
      pUVar11->ineff_expands = uVar17;
      kVar22 = KTX_SUCCESS;
      if (1 < uVar17) {
        pUVar11->noexpand = 1;
        kVar22 = KTX_SUCCESS;
      }
    }
  }
  return kVar22;
}

Assistant:

KTX_error_code
ktxHashList_AddKVPair(ktxHashList* pHead, const char* key, unsigned int valueLen, const void* value)
{
    if (pHead && key && (valueLen == 0 || value)) {
        unsigned int keyLen = (unsigned int)strlen(key) + 1;
        ktxKVListEntry* kv;

        if (keyLen == 1)
            return KTX_INVALID_VALUE;   /* Empty string */

        /* Allocate all the memory as a block */
        kv = (ktxKVListEntry*)malloc(sizeof(ktxKVListEntry) + keyLen + valueLen);
        /* Put key first */
        kv->key = (char *)kv + sizeof(ktxKVListEntry);
        kv->keyLen = keyLen;
        memcpy(kv->key, key, keyLen);
        /* then value */
        kv->valueLen = valueLen;
        if (valueLen > 0) {
            kv->value = kv->key + keyLen;
            memcpy(kv->value, value, valueLen);
        } else {
            kv->value = 0;
        }

        HASH_ADD_KEYPTR( hh, *pHead, kv->key, kv->keyLen-1, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}